

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n<ProjectBuilderSources,long_long>
               (ProjectBuilderSources *first,longlong n,ProjectBuilderSources *d_first)

{
  long in_FS_OFFSET;
  ProjectBuilderSources *local_18;
  ProjectBuilderSources *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((n != 0) && (d_first != (ProjectBuilderSources *)0x0)) &&
      (first != (ProjectBuilderSources *)0x0)) && (first != d_first)) {
    if (d_first < first) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        q_relocate_overlap_n_left_move<ProjectBuilderSources*,long_long>(first,n,d_first);
        return;
      }
      goto LAB_0014d419;
    }
    local_10 = first + n;
    local_18 = d_first + n;
    q_relocate_overlap_n_left_move<std::reverse_iterator<ProjectBuilderSources*>,long_long>
              ((ProjectBuilderSources *)&local_10,n,(ProjectBuilderSources *)&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0014d419:
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n(T *first, N n, T *d_first)
{
    static_assert(std::is_nothrow_destructible_v<T>,
                  "This algorithm requires that T has a non-throwing destructor");

    if (n == N(0) || first == d_first || first == nullptr || d_first == nullptr)
        return;

    if constexpr (QTypeInfo<T>::isRelocatable) {
        std::memmove(static_cast<void *>(d_first), static_cast<const void *>(first), n * sizeof(T));
    } else { // generic version has to be used
        if (d_first < first) {
            q_relocate_overlap_n_left_move(first, n, d_first);
        } else { // first < d_first
            auto rfirst = std::make_reverse_iterator(first + n);
            auto rd_first = std::make_reverse_iterator(d_first + n);
            q_relocate_overlap_n_left_move(rfirst, n, rd_first);
        }
    }
}